

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int marktime(int *status)

{
  undefined1 local_20 [8];
  timeval tv;
  int *status_local;
  
  tv.tv_usec = (__suseconds_t)status;
  gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  startsec = (long)local_20;
  startmilli = (int)(tv.tv_sec / 1000);
  scpu = clock();
  return *(int *)tv.tv_usec;
}

Assistant:

int marktime(int *status)
{
#if defined(unix) || defined(__unix__)  || defined(__unix)
        struct  timeval tv;
/*        struct  timezone tz; */

/*        gettimeofday (&tv, &tz); */
        gettimeofday (&tv, NULL);

	startsec = tv.tv_sec;
        startmilli = tv.tv_usec/1000;

        scpu = clock();
#else
/* don't support high timing precision on Windows machines */
     	startsec = 0;
        startmilli = 0;

        scpu = clock();
#endif
	return( *status );
}